

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O1

bool AString_replaceRangeCString(AString *str,size_t index,size_t count,char *cstr,size_t len)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  bVar2 = false;
  if (str != (AString *)0x0) {
    uVar1 = str->size;
    if (cstr == (char *)0x0 || len == 0) {
      bVar2 = true;
      if (index < uVar1) {
        if (count < ~index && count + index < uVar1) {
          str->size = uVar1 - count;
          memmove(str->buffer + index,str->buffer + index + count,((uVar1 - count) - index) + 1);
        }
        else {
          str->size = index;
          str->buffer[index] = '\0';
        }
      }
    }
    else {
      sVar3 = uVar1 - index;
      if (uVar1 < index || sVar3 == 0) {
        bVar2 = AString_insertCString(str,0xffffffffffffffff,cstr,len);
        return bVar2;
      }
      sVar5 = sVar3;
      if (count + index < uVar1) {
        sVar5 = count;
      }
      if (~index <= count) {
        sVar5 = sVar3;
      }
      uVar4 = sVar5 - len;
      if (sVar5 < len || uVar4 == 0) {
        if (sVar5 < len) {
          sVar3 = (len - sVar5) + uVar1;
          bVar2 = AString_reserve(str,sVar3);
          if (bVar2 == false) {
            return false;
          }
          memmove(str->buffer + len + index,str->buffer + sVar5 + index,
                  (str->size - (sVar5 + index)) + 1);
          str->size = sVar3;
        }
      }
      else if (uVar4 < ~index && uVar4 + index < uVar1) {
        str->size = uVar1 - uVar4;
        memmove(str->buffer + index,str->buffer + index + uVar4,((uVar1 - uVar4) - index) + 1);
      }
      else {
        str->size = index;
        str->buffer[index] = '\0';
      }
      memcpy(str->buffer + index,cstr,len);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceRangeCString(struct AString *str, size_t index, size_t count, const char *cstr, size_t len)
{
    if(str == nullptr) {
        return false;
    } else if(cstr == nullptr || len == 0) {
        AString_remove(str, index, count);
        return true;
    }
    if(index >= str->size)
        return AString_appendCString(str, cstr, len);
    if(count >= ((size_t) 0) - index - 1 || index + count >= str->size)
        count = str->size - index;
    if(len < count) {
        AString_remove(str, index, count - len);
    } else if(len > count) {
        size_t requiredSize = str->size + (len - count);
        if(!AString_reserve(str, requiredSize))
            return false;
        memmove(str->buffer + index + len, str->buffer + index + count, str->size - index - count + 1);
        str->size = requiredSize;
    }
    memcpy(str->buffer + index, cstr, len * sizeof(char));
    return true;
}